

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileAction.cpp
# Opt level: O0

void __thiscall QFileActionPrivate::~QFileActionPrivate(QFileActionPrivate *this)

{
  QObject *in_RDI;
  
  *(undefined ***)in_RDI = &PTR_metaObject_0026b8d0;
  QList<QString>::~QList((QList<QString> *)0x21b9ea);
  QString::~QString((QString *)0x21b9f8);
  QString::~QString((QString *)0x21ba06);
  QString::~QString((QString *)0x21ba14);
  QObject::~QObject(in_RDI);
  return;
}

Assistant:

class QFileActionPrivate : public QObject {
    Q_OBJECT

public:
    explicit QFileActionPrivate(QFileAction *actionP)
        : QObject(actionP)
        , action(actionP)
        , type(QFileAction::Type::OpenFile)
        , options() {
        Q_ASSERT(action);

        updateIcon();

        connect(action, &QAction::triggered, this, &QFileActionPrivate::triggered);
    }

    void updateIcon() {
        switch (type) {
        case QFileAction::Type::OpenFile:
            action->setIcon(qApp->style()->standardIcon(QStyle::SP_DialogOpenButton));
            break;
        case QFileAction::Type::SaveFile:
            action->setIcon(qApp->style()->standardIcon(QStyle::SP_DialogSaveButton));
            break;
        case QFileAction::Type::OpenFolder:
            action->setIcon(qApp->style()->standardIcon(QStyle::SP_DirIcon));
            break;
        }
    }